

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

char * luaL_checklstring(lua_State *L,int idx,size_t *len)

{
  ulong in_RAX;
  TValue *pTVar1;
  
  pTVar1 = index2adr(L,idx);
  if ((pTVar1->field_2).it == 0xfffffffb) {
    in_RAX = (ulong)(pTVar1->u32).lo;
  }
  else {
    luaL_checklstring_cold_1();
  }
  if (len != (size_t *)0x0) {
    *len = (ulong)*(uint *)(in_RAX + 0xc);
  }
  return (char *)(in_RAX + 0x10);
}

Assistant:

LUALIB_API const char *luaL_checklstring(lua_State *L, int idx, size_t *len)
{
  TValue *o = index2adr(L, idx);
  GCstr *s;
  if (LJ_LIKELY(tvisstr(o))) {
    s = strV(o);
  } else if (tvisnumber(o)) {
    lj_gc_check(L);
    o = index2adr(L, idx);  /* GC may move the stack. */
    s = lj_strfmt_number(L, o);
    setstrV(L, o, s);
  } else {
    lj_err_argt(L, idx, LUA_TSTRING);
  }
  if (len != NULL) *len = s->len;
  return strdata(s);
}